

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keywords.cpp
# Opt level: O2

SyntaxKind psy::C::Lexer::translate(char *s,int n,ParseOptions *opts)

{
  char cVar1;
  SyntaxKind SVar2;
  
  SVar2 = IdentifierToken;
  switch(n) {
  case 2:
    if (*s != 'o') {
      return IdentifierToken;
    }
    SVar2 = BarBarToken;
    cVar1 = s[1];
    break;
  case 3:
    cVar1 = *s;
    if (cVar1 != 'x') {
      if (cVar1 == 'n') {
        if (s[1] != 'o') {
          return IdentifierToken;
        }
        if (s[2] != 't') {
          return IdentifierToken;
        }
        return ExclamationToken;
      }
      if (cVar1 != 'a') {
        return IdentifierToken;
      }
      if (s[1] != 'n') {
        return IdentifierToken;
      }
      SVar2 = AmpersandAmpersandToken;
      cVar1 = s[2];
joined_r0x002e1eef:
      if (cVar1 == 'd') {
        return SVar2;
      }
      return IdentifierToken;
    }
    if (s[1] != 'o') {
      return IdentifierToken;
    }
    SVar2 = CaretToken;
    cVar1 = s[2];
    break;
  default:
    goto switchD_002e1d46_caseD_4;
  case 5:
    cVar1 = *s;
    if (cVar1 == 'o') {
      if (s[1] != 'r') {
        return IdentifierToken;
      }
      if (s[2] != '_') {
        return IdentifierToken;
      }
      if (s[3] != 'e') {
        return IdentifierToken;
      }
      SVar2 = BarEqualsToken;
      cVar1 = s[4];
      goto joined_r0x002e1f35;
    }
    if (cVar1 == 'c') {
      if (s[1] != 'o') {
        return IdentifierToken;
      }
      if (s[2] != 'm') {
        return IdentifierToken;
      }
      if (s[3] != 'p') {
        return IdentifierToken;
      }
      if (s[4] != 'l') {
        return IdentifierToken;
      }
      return OperatorName_COMPLToken;
    }
    if (cVar1 != 'b') {
      return IdentifierToken;
    }
    if (s[1] != 'i') {
      return IdentifierToken;
    }
    if (s[2] != 't') {
      return IdentifierToken;
    }
    if (s[3] != 'o') {
      return IdentifierToken;
    }
    SVar2 = BarToken;
    cVar1 = s[4];
    break;
  case 6:
    cVar1 = *s;
    if (cVar1 == 'x') {
      if (s[1] != 'o') {
        return IdentifierToken;
      }
      if (s[2] != 'r') {
        return IdentifierToken;
      }
      if (s[3] != '_') {
        return IdentifierToken;
      }
      if (s[4] != 'e') {
        return IdentifierToken;
      }
      SVar2 = CaretEqualsToken;
    }
    else {
      if (cVar1 == 'b') {
        if (s[1] != 'i') {
          return IdentifierToken;
        }
        if (s[2] != 't') {
          return IdentifierToken;
        }
        if (s[3] != 'a') {
          return IdentifierToken;
        }
        if (s[4] != 'n') {
          return IdentifierToken;
        }
        SVar2 = AmpersandToken;
        cVar1 = s[5];
        goto joined_r0x002e1eef;
      }
      if (cVar1 == 'n') {
        if (s[1] != 'o') {
          return IdentifierToken;
        }
        if (s[2] != 't') {
          return IdentifierToken;
        }
        if (s[3] != '_') {
          return IdentifierToken;
        }
        if (s[4] != 'e') {
          return IdentifierToken;
        }
        SVar2 = ExclamationEqualsToken;
      }
      else {
        if (cVar1 != 'a') {
          return IdentifierToken;
        }
        if (s[1] != 'n') {
          return IdentifierToken;
        }
        if (s[2] != 'd') {
          return IdentifierToken;
        }
        if (s[3] != '_') {
          return IdentifierToken;
        }
        if (s[4] != 'e') {
          return IdentifierToken;
        }
        SVar2 = AmpersandEqualsToken;
      }
    }
    cVar1 = s[5];
joined_r0x002e1f35:
    if (cVar1 != 'q') {
      return IdentifierToken;
    }
    goto switchD_002e1d46_caseD_4;
  }
  if (cVar1 != 'r') {
    return IdentifierToken;
  }
switchD_002e1d46_caseD_4:
  return SVar2;
}

Assistant:

SyntaxKind Lexer::translate(const char* s, int n, const ParseOptions& opts)
{
    switch (n) {
        case 2: return translate2(s);
        case 3: return translate3(s);
        case 5: return translate5(s);
        case 6: return translate6(s);
        default: return SyntaxKind::IdentifierToken;
    }
}